

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,TextureMap *textures,string *propName,
          aiTextureType target,MeshGeometry *mesh)

{
  Texture *tex;
  PropertyTable *this_00;
  pointer ppaVar1;
  undefined8 uVar2;
  int iVar3;
  const_iterator cVar4;
  Property *pPVar5;
  long lVar6;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var7;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar8;
  long *plVar9;
  MeshGeometry *this_01;
  MatIndexArray *pMVar10;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  _Base_ptr p_Var12;
  undefined8 *puVar13;
  size_type *psVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  int uvIndex;
  uint matIndex;
  aiString path;
  uint local_644;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  aiTextureType local_620;
  uint local_61c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  aiMaterial *local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  undefined4 local_5cc;
  _Rb_tree_node_base *local_5c8;
  undefined1 local_5c0 [112];
  ios_base local_550 [264];
  aiVector2D local_448;
  aiVector2D aStack_440;
  undefined4 local_438;
  aiString local_434;
  
  local_5f8 = out_mat;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
          ::find(&textures->_M_t,propName);
  if ((_Rb_tree_header *)cVar4._M_node == &(textures->_M_t)._M_impl.super__Rb_tree_header) {
    return;
  }
  tex = *(Texture **)(cVar4._M_node + 2);
  if (tex == (Texture *)0x0) {
    return;
  }
  GetTexturePath(&local_434,this,tex);
  aiMaterial::AddProperty(local_5f8,&local_434,"$tex.file",target,0);
  local_438 = 0;
  local_448 = tex->uvTrans;
  aStack_440 = tex->uvScaling;
  aiMaterial::AddBinaryProperty(local_5f8,&local_448,0x14,"$tex.uvtrafo",target,0,aiPTI_Float);
  this_00 = (tex->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (PropertyTable *)0x0) {
    __assert_fail("props.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.h"
                  ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
  }
  local_644 = 0;
  local_5c0._0_8_ = local_5c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"UVSet","");
  pPVar5 = PropertyTable::Get(this_00,(string *)local_5c0);
  if ((pPVar5 == (Property *)0x0) ||
     (lVar6 = __dynamic_cast(pPVar5,&Property::typeinfo,
                             &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar6 == 0)) {
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    local_5f0._M_string_length = 0;
    local_5f0.field_2._M_local_buf[0] = '\0';
    bVar17 = false;
  }
  else {
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    bVar17 = true;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5f0,*(long *)(lVar6 + 8),
               *(long *)(lVar6 + 0x10) + *(long *)(lVar6 + 8));
  }
  if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  if (((!bVar17) || (iVar3 = std::__cxx11::string::compare((char *)&local_5f0), iVar3 == 0)) ||
     (local_5f0._M_string_length == 0)) goto LAB_005dfad8;
  ppaVar1 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                    (ppaVar1,(this->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_5f8);
  local_5cc = (undefined4)((ulong)((long)_Var7._M_current - (long)ppaVar1) >> 3);
  local_644 = 0xffffffff;
  if (mesh == (MeshGeometry *)0x0) {
    p_Var12 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_5c8 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var12 != local_5c8) {
      uVar16 = 0xffffffff;
      local_620 = target;
      do {
        uVar15 = local_644;
        if ((*(long *)(p_Var12 + 1) != 0) &&
           (this_01 = (MeshGeometry *)
                      __dynamic_cast(*(long *)(p_Var12 + 1),&Geometry::typeinfo,
                                     &MeshGeometry::typeinfo,0), uVar15 = local_644,
           target = local_620, this_01 != (MeshGeometry *)0x0)) {
          pMVar10 = MeshGeometry::GetMaterialIndices(this_01);
          local_61c = uVar16;
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                             ((pMVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start,
                              (pMVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish,&local_5cc);
          uVar15 = local_644;
          target = local_620;
          uVar16 = local_61c;
          if (_Var11._M_current !=
              (pMVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar16 = 0xffffffff;
            uVar15 = 0;
            do {
              pvVar8 = MeshGeometry::GetTextureCoords(this_01,uVar15);
              if ((pvVar8->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start ==
                  (pvVar8->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
              MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                        ((string *)local_5c0,this_01,uVar15);
              uVar2 = local_5c0._0_8_;
              if (local_5c0._8_8_ == local_5f0._M_string_length) {
                if (local_5c0._8_8_ == 0) {
                  bVar17 = false;
                  uVar16 = uVar15;
                }
                else {
                  iVar3 = bcmp((void *)local_5c0._0_8_,local_5f0._M_dataplus._M_p,local_5c0._8_8_);
                  bVar17 = iVar3 != 0;
                  if (!bVar17) {
                    uVar16 = uVar15;
                  }
                }
              }
              else {
                bVar17 = true;
              }
              if ((undefined1 *)uVar2 != local_5c0 + 0x10) {
                operator_delete((void *)uVar2,local_5c0._16_8_ + 1);
              }
              bVar18 = uVar15 < 7;
              uVar15 = uVar15 + 1;
            } while ((bool)(bVar17 & bVar18));
            target = local_620;
            if (uVar16 == 0xffffffff) {
              std::operator+(&local_618,"did not find UV channel named ",&local_5f0);
              target = local_620;
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_618);
              uVar16 = local_61c;
              local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
              psVar14 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_640.field_2._M_allocated_capacity = *psVar14;
                local_640.field_2._8_8_ = puVar13[3];
              }
              else {
                local_640.field_2._M_allocated_capacity = *psVar14;
                local_640._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_640._M_string_length = puVar13[1];
              *puVar13 = psVar14;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5c0,&local_640);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
            }
            else {
              uVar15 = uVar16;
              if (local_61c == 0xffffffff) goto LAB_005df935;
              std::operator+(&local_618,"the UV channel named ",&local_5f0);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_618);
              uVar16 = local_61c;
              local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
              psVar14 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_640.field_2._M_allocated_capacity = *psVar14;
                local_640.field_2._8_8_ = plVar9[3];
              }
              else {
                local_640.field_2._M_allocated_capacity = *psVar14;
                local_640._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_640._M_string_length = plVar9[1];
              *plVar9 = (long)psVar14;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5c0,&local_640);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
            std::ios_base::~ios_base(local_550);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_640._M_dataplus._M_p != &local_640.field_2) {
              operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1
                             );
            }
            uVar15 = local_644;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._M_dataplus._M_p != &local_618.field_2) {
              operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1
                             );
              uVar15 = local_644;
            }
          }
        }
LAB_005df935:
        local_644 = uVar15;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        uVar15 = local_644;
      } while (p_Var12 != local_5c8);
      goto LAB_005df9e8;
    }
  }
  else {
    uVar16 = 0xffffffff;
    uVar15 = 0;
    do {
      pvVar8 = MeshGeometry::GetTextureCoords(mesh,uVar15);
      if ((pvVar8->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pvVar8->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) break;
      MeshGeometry::GetTextureCoordChannelName_abi_cxx11_((string *)local_5c0,mesh,uVar15);
      uVar2 = local_5c0._0_8_;
      if (local_5c0._8_8_ == local_5f0._M_string_length) {
        if (local_5c0._8_8_ == 0) {
          bVar17 = true;
          uVar16 = uVar15;
        }
        else {
          iVar3 = bcmp((void *)local_5c0._0_8_,local_5f0._M_dataplus._M_p,local_5c0._8_8_);
          bVar17 = iVar3 == 0;
          if (bVar17) {
            uVar16 = uVar15;
          }
        }
      }
      else {
        bVar17 = false;
      }
      if ((undefined1 *)uVar2 != local_5c0 + 0x10) {
        operator_delete((void *)uVar2,local_5c0._16_8_ + 1);
      }
      bVar18 = uVar15 != 7;
      uVar15 = uVar15 + 1;
    } while (!bVar17 && bVar18);
    uVar15 = uVar16;
    if (uVar16 == 0xffffffff) {
      std::operator+(&local_618,"did not find UV channel named ",&local_5f0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_618);
      psVar14 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_640.field_2._M_allocated_capacity = *psVar14;
        local_640.field_2._8_8_ = plVar9[3];
        local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
      }
      else {
        local_640.field_2._M_allocated_capacity = *psVar14;
        local_640._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_640._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5c0,
                 &local_640);
      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
      std::ios_base::~ios_base(local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_dataplus._M_p != &local_618.field_2) {
        operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
      }
    }
LAB_005df9e8:
    local_644 = uVar15;
    if (uVar16 != 0xffffffff) goto LAB_005dfad8;
  }
  std::operator+(&local_618,"failed to resolve UV channel ",&local_5f0);
  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_618);
  psVar14 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_640.field_2._M_allocated_capacity = *psVar14;
    local_640.field_2._8_8_ = puVar13[3];
    local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  }
  else {
    local_640.field_2._M_allocated_capacity = *psVar14;
    local_640._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_640._M_string_length = puVar13[1];
  *puVar13 = psVar14;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5c0,
             &local_640);
  LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
  std::ios_base::~ios_base(local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  local_644 = 0;
LAB_005dfad8:
  aiMaterial::AddBinaryProperty(local_5f8,&local_644,4,"$tex.uvwsrc",target,0,aiPTI_Integer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,
                    CONCAT71(local_5f0.field_2._M_allocated_capacity._1_7_,
                             local_5f0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const TextureMap& textures,
                const std::string& propName,
                aiTextureType target, const MeshGeometry* const mesh) {
            TextureMap::const_iterator it = textures.find(propName);
            if (it == textures.end()) {
                return;
            }

            const Texture* const tex = (*it).second;
            if (tex != 0)
            {
                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, 0);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, 0);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));


                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, 0);
            }
        }